

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O1

void __thiscall
sock_tests::recv_until_terminator_limit::test_method(recv_until_terminator_limit *this)

{
  CThreadInterrupt *pCVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  Span<const_char> data;
  const_string file;
  Span<const_char> data_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  thread receiver;
  minutes timeout;
  Sock sock_recv;
  Sock sock_send;
  int s [2];
  CThreadInterrupt interrupt;
  check_type cVar3;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_118;
  char *local_110;
  lazy_ostream local_108;
  undefined1 *local_f8;
  char *local_f0;
  assertion_result local_e8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  long local_b0;
  long local_a8;
  Sock local_a0;
  Sock local_90;
  SOCKET local_80;
  SOCKET local_7c;
  CThreadInterrupt local_78;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = 1;
  CThreadInterrupt::CThreadInterrupt(&local_78);
  CreateSocketPair((int *)&local_80);
  Sock::Sock(&local_90,local_80);
  Sock::Sock(&local_a0,local_7c);
  local_b0 = 0;
  local_108._vptr_lazy_ostream = (_func_int **)operator_new(0x20);
  *local_108._vptr_lazy_ostream = (_func_int *)&PTR___State_013d86d8;
  local_108._vptr_lazy_ostream[1] = (_func_int *)&local_a0;
  local_108._vptr_lazy_ostream[2] = (_func_int *)&local_a8;
  local_108._vptr_lazy_ostream[3] = (_func_int *)&local_78;
  std::thread::_M_start_thread(&local_b0,&local_108,0);
  if (local_108._vptr_lazy_ostream != (_func_int **)0x0) {
    (**(code **)(*local_108._vptr_lazy_ostream + 8))();
  }
  pCVar1 = &local_78;
  data.m_size = 8;
  data.m_data = "1234567";
  Sock::SendComplete(&local_90,data,(milliseconds)(local_a8 * 60000),pCVar1);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa6;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)pCVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d8718;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "no exceptions thrown by sock_send.SendComplete(\"1234567\", timeout, interrupt)";
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_110 = "";
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_108,2,1,WARN,_cVar3,(size_t)&local_118,0xa6);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  pCVar1 = &local_78;
  data_00.m_size = 5;
  data_00.m_data = "89a\n";
  Sock::SendComplete(&local_90,data_00,(milliseconds)(local_a8 * 60000),pCVar1);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa7;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = (iterator)pCVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d8758;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "no exceptions thrown by sock_send.SendComplete(\"89a\\n\", timeout, interrupt)";
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_170 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_108,2,1,WARN,_cVar3,(size_t)&local_178,0xa7);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  std::thread::join();
  if (local_b0 == 0) {
    Sock::~Sock(&local_a0);
    Sock::~Sock(&local_90);
    std::condition_variable::~condition_variable(&local_78.cond);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    __stack_chk_fail();
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(recv_until_terminator_limit)
{
    constexpr auto timeout = 1min; // High enough so that it is never hit.
    CThreadInterrupt interrupt;
    int s[2];
    CreateSocketPair(s);

    Sock sock_send(s[0]);
    Sock sock_recv(s[1]);

    std::thread receiver([&sock_recv, &timeout, &interrupt]() {
        constexpr size_t max_data{10};
        bool threw_as_expected{false};
        // BOOST_CHECK_EXCEPTION() writes to some variables shared with the main thread which
        // creates a data race. So mimic it manually.
        try {
            (void)sock_recv.RecvUntilTerminator('\n', timeout, interrupt, max_data);
        } catch (const std::runtime_error& e) {
            threw_as_expected = HasReason("too many bytes without a terminator")(e);
        }
        assert(threw_as_expected);
    });

    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("1234567", timeout, interrupt));
    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("89a\n", timeout, interrupt));

    receiver.join();
}